

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void sweep(Vm *vm)

{
  long lVar1;
  Object *object_00;
  size_t sVar2;
  Object *unreached;
  Object **object;
  Vm *vm_local;
  
  unreached = (Object *)&vm->first_object;
  while (lVar1._0_1_ = unreached->marked, lVar1._1_3_ = *(undefined3 *)&unreached->field_0x1,
        lVar1._4_4_ = unreached->type, lVar1 != 0) {
    if (**(char **)unreached == '\0') {
      object_00 = *(Object **)unreached;
      *(object_t **)unreached = object_00->next;
      sVar2 = free_object(object_00);
      vm->allocated_mem = vm->allocated_mem - sVar2;
    }
    else {
      **(undefined1 **)unreached = 0;
      unreached = (Object *)(*(long *)unreached + 8);
    }
  }
  return;
}

Assistant:

static void sweep(Vm *vm) {
    Object **object = &vm->first_object;
    while (*object) {
        if (!(*object)->marked) {
            Object *unreached = *object;
            *object = unreached->next;

            // TODO don't free referenced elements in list
            vm->allocated_mem -= free_object(unreached);
        } else {
            (*object)->marked = 0;
            object = &(*object)->next;
        }
    }
}